

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasmMMU_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmPLoad<(moira::Instr)183,(moira::Mode)10,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  u32 uVar2;
  StrWriter *this_00;
  char *str_00;
  Ea<(moira::Mode)10,_4> ea;
  Ea<(moira::Mode)10,_4> local_44;
  
  uVar1 = *addr;
  uVar2 = dasmIncRead<2>(this,addr);
  Op<(moira::Mode)10,4>(&local_44,this,op & 7,addr);
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    *addr = uVar1;
    dasmIllegal<(moira::Instr)183,(moira::Mode)10,4>(this,str,addr,op);
  }
  else {
    this_00 = StrWriter::operator<<(str);
    str_00 = "r";
    if ((uVar2 >> 9 & 1) == 0) {
      str_00 = "w";
    }
    StrWriter::operator<<(this_00,str_00);
    StrWriter::operator<<(this_00,(Tab)(str->tab).raw);
    StrWriter::operator<<(str,(Fc)(uVar2 & 0x1f));
    StrWriter::operator<<(str);
    StrWriter::operator<<(str,&local_44);
  }
  return;
}

Assistant:

void
Moira::dasmPLoad(StrWriter &str, u32 &addr, u16 op) const
{
    auto old = addr;
    auto ext = dasmIncRead<Word>(addr);
    auto ea  = Op <M,S> ( _____________xxx(op), addr );

    // Catch illegal extension words
    if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

        if (!isValidExtMMU(I, M, op, ext)) {

            addr = old;
            dasmIllegal<I, M, S>(str, addr, op);
            return;
        }
    }

    str << Ins<I>{} << ((ext & 0x200) ? "r" : "w") << str.tab;
    str << Fc(ext & 0b11111) << Sep{} << ea;
}